

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(PathTypeHandlerBase *this,DynamicObject *object)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  int iVar5;
  undefined4 *puVar6;
  Var ptr;
  Var ptr_00;
  ulong uVar7;
  WriteBarrierPtr<void> *this_00;
  WriteBarrierPtr<void> *pWVar8;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35d,"(object)","object");
    if (!bVar3) goto LAB_00c4915c;
    *puVar6 = 0;
  }
  bVar3 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35e,"(!this->IsObjectHeaderInlinedTypeHandler())",
                                "Already ObjectHeaderInlined?");
    if (!bVar3) goto LAB_00c4915c;
    *puVar6 = 0;
  }
  bVar3 = DynamicObject::HasObjectArray(object);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35f,"(!object->HasObjectArray())",
                                "Can\'t move auxSlots to inline when we have ObjectArray");
    if (!bVar3) goto LAB_00c4915c;
    *puVar6 = 0;
  }
  if ((uint)((this->super_DynamicTypeHandler).unusedBytes >> 1) -
      (uint)(this->super_DynamicTypeHandler).inlineSlotCapacity != 3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x364,
                                "(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3)"
                                ,"Should have only 3 values in auxSlot");
    if (!bVar3) goto LAB_00c4915c;
    *puVar6 = 0;
  }
  ptr = DynamicObject::GetAuxSlot(object,0);
  ptr_00 = DynamicObject::GetAuxSlot(object,1);
  uVar1 = (this->super_DynamicTypeHandler).offsetOfInlineSlots;
  uVar4 = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  pWVar8 = (WriteBarrierPtr<void> *)
           ((long)&(object->super_RecyclableObject).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar4);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjectHeaderInliningPhase);
  if (bVar3) {
    Output::Print(
                 L"ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"
                 );
    Output::Flush();
  }
  this_00 = pWVar8;
  for (uVar7 = 0; uVar7 < (this->super_DynamicTypeHandler).inlineSlotCapacity; uVar7 = uVar7 + 1) {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              (this_00,*(void **)((long)&(&(object->super_RecyclableObject).super_FinalizableObject)
                                         [uVar7].super_IRecyclerVisitedObject.
                                         _vptr_IRecyclerVisitedObject + (ulong)uVar1));
    this_00 = this_00 + 1;
  }
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(this_00,ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(pWVar8 + ((int)uVar7 + 1U & 0xffff),ptr_00);
  iVar5 = (*((((this->predecessorType).ptr)->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,899,
                                "(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler())"
                                ,"this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler()"
                               );
    if (!bVar3) goto LAB_00c4915c;
    *puVar6 = 0;
  }
  if ((Type)(((((this->predecessorType).ptr)->typeHandler).ptr)->inlineSlotCapacity - 2) !=
      (short)uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,900,
                                "(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity())"
                                ,
                                "propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity()"
                               );
    if (!bVar3) {
LAB_00c4915c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(DynamicObject *const object)
    {
        Assert(object);
        AssertMsg(!this->IsObjectHeaderInlinedTypeHandler(), "Already ObjectHeaderInlined?");
        AssertMsg(!object->HasObjectArray(), "Can't move auxSlots to inline when we have ObjectArray");

        // When transition from ObjectHeaderInlined to auxSlot happend 2 properties where moved from inlineSlot to auxSlot
        // as we have to have space for auxSlot and objectArray (see DynamicTypeHandler::AdjustSlots). And then the new
        // property was added at 3rd index in auxSlot
        AssertMsg(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3, "Should have only 3 values in auxSlot");

        // Get the auxSlot[0] and auxSlot[1] value as we will over write it
        Var auxSlotZero = object->GetAuxSlot(0);
        Var auxSlotOne = object->GetAuxSlot(1);

#ifdef EXPLICIT_FREE_SLOTS
        Var auxSlots = object->auxSlots;
        const int auxSlotsCapacity = this->GetSlotCapacity() - this->GetInlineSlotCapacity();
#endif
        // Move all current inline slots up to object header inline offset
        Var *const oldInlineSlots = reinterpret_cast<Var *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfInlineSlots());
        Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfObjectHeaderInlineSlots());

        PHASE_PRINT_TRACE1(ObjectHeaderInliningPhase, _u("ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"));

        PropertyIndex propertyIndex = 0;
        while (propertyIndex < this->GetInlineSlotCapacity())
        {
            newInlineSlots[propertyIndex] = oldInlineSlots[propertyIndex];
            propertyIndex++;
        }

        // auxSlot should only have 2 entry, move that to inlineSlot
        newInlineSlots[propertyIndex++] = auxSlotZero;
        newInlineSlots[propertyIndex++] = auxSlotOne;

#ifdef EXPLICIT_FREE_SLOTS
        object->GetRecycler()->ExplicitFreeNonLeaf(auxSlots, auxSlotsCapacity * sizeof(Var));
#endif

        Assert(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler());
        Assert(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity());
    }